

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O0

void __thiscall RVO::RVOSimulator::~RVOSimulator(RVOSimulator *this)

{
  Agent *pAVar1;
  KdTree *this_00;
  size_type sVar2;
  reference ppAVar3;
  reference ppOVar4;
  ulong local_20;
  size_t i_1;
  size_t i;
  RVOSimulator *this_local;
  
  if ((this->defaultAgent_ != (Agent *)0x0) &&
     (pAVar1 = this->defaultAgent_, pAVar1 != (Agent *)0x0)) {
    Agent::~Agent(pAVar1);
    operator_delete(pAVar1,0x98);
  }
  for (i_1 = 0; sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size
                                  (&this->agents_), i_1 < sVar2; i_1 = i_1 + 1) {
    ppAVar3 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                        (&this->agents_,i_1);
    pAVar1 = *ppAVar3;
    if (pAVar1 != (Agent *)0x0) {
      Agent::~Agent(pAVar1);
      operator_delete(pAVar1,0x98);
    }
  }
  for (local_20 = 0;
      sVar2 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::size
                        (&this->obstacles_), local_20 < sVar2; local_20 = local_20 + 1) {
    ppOVar4 = std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::operator[]
                        (&this->obstacles_,local_20);
    if (*ppOVar4 != (value_type)0x0) {
      operator_delete(*ppOVar4,0x30);
    }
  }
  this_00 = this->kdTree_;
  if (this_00 != (KdTree *)0x0) {
    KdTree::~KdTree(this_00);
    operator_delete(this_00,0x40);
  }
  std::vector<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::~vector(&this->obstacles_);
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::~vector(&this->agents_);
  return;
}

Assistant:

RVOSimulator::~RVOSimulator()
	{
		if (defaultAgent_ != NULL) {
			delete defaultAgent_;
		}

		for (size_t i = 0; i < agents_.size(); ++i) {
			delete agents_[i];
		}

		for (size_t i = 0; i < obstacles_.size(); ++i) {
			delete obstacles_[i];
		}

		delete kdTree_;
	}